

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam.c
# Opt level: O2

void la_miam_xon_ind_format_text(la_vstring *vstr,void *data,int indent)

{
  uint uVar1;
  
  uVar1 = indent + 1;
  if (*data == 0xfff) {
    la_vstring_append_sprintf(vstr,"%*sFile ID: 0xFFF (all)\n",(ulong)uVar1,"");
  }
  else {
    la_vstring_append_sprintf(vstr,"%*sFile ID: %u\n",(ulong)uVar1,"");
  }
  la_vstring_append_sprintf
            (vstr,"%*sOn-ground segment temporization: %u sec\n",(ulong)uVar1,"",
             (ulong)*(ushort *)((long)data + 2));
  la_vstring_append_sprintf
            (vstr,"%*sIn-flight segment temporization: %u sec\n",(ulong)uVar1,"",
             (ulong)*(ushort *)((long)data + 4));
  return;
}

Assistant:

static void la_miam_xon_ind_format_text(la_vstring *vstr, void const *data, int indent) {
	la_assert(vstr);
	la_assert(data);
	la_assert(indent >= 0);

	la_miam_xon_ind_msg const *msg = data;
	indent++;
	if(msg->file_id == 0xFFF) {
		LA_ISPRINTF(vstr, indent, "File ID: 0xFFF (all)\n");
	} else {
		LA_ISPRINTF(vstr, indent, "File ID: %u\n", msg->file_id);
	}
	LA_ISPRINTF(vstr, indent, "On-ground segment temporization: %u sec\n", msg->onground_segment_tempo);
	LA_ISPRINTF(vstr, indent, "In-flight segment temporization: %u sec\n", msg->inflight_segment_tempo);
}